

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void pbrt::LogFatal<char_const(&)[23]>
               (LogLevel level,char *file,int line,char *fmt,char (*args) [23])

{
  string s;
  char (*in_stack_ffffffffffffffb0) [23];
  char *in_stack_ffffffffffffffb8;
  
  StringPrintf<char_const(&)[23]>(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::c_str();
  LogFatal(args._4_4_,(char *)s.field_2._8_8_,s.field_2._M_allocated_capacity._4_4_,
           (char *)s._M_string_length);
}

Assistant:

inline void LogFatal(LogLevel level, const char *file, int line, const char *fmt,
                     Args &&...args) {
#ifdef PBRT_IS_GPU_CODE
    LogFatal(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    LogFatal(level, file, line, s.c_str());
#endif
}